

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

ini_t * ini_load(char *data,void *memctx)

{
  int iVar1;
  char *value;
  char *pcVar2;
  ini_t *ini_00;
  char *pcVar3;
  bool bVar4;
  int l;
  char *start2;
  char *start;
  char *pcStack_28;
  int s;
  char *ptr;
  ini_t *ini;
  void *memctx_local;
  char *data_local;
  
  ini_00 = ini_create(memctx);
  if (data != (char *)0x0) {
    start._4_4_ = 0;
    pcStack_28 = data;
    while (*pcStack_28 != '\0') {
      while( true ) {
        pcVar3 = pcStack_28;
        bVar4 = false;
        if (*pcStack_28 != '\0') {
          bVar4 = *pcStack_28 < '!';
        }
        if (!bVar4) break;
        pcStack_28 = pcStack_28 + 1;
      }
      if (*pcStack_28 == '\0') {
        return ini_00;
      }
      if (*pcStack_28 == ';') {
        while( true ) {
          bVar4 = false;
          if (*pcStack_28 != '\0') {
            bVar4 = *pcStack_28 != '\n';
          }
          if (!bVar4) break;
          pcStack_28 = pcStack_28 + 1;
        }
      }
      else if (*pcStack_28 == '[') {
        pcVar3 = pcStack_28 + 1;
        pcStack_28 = pcVar3;
        while( true ) {
          bVar4 = false;
          if ((*pcStack_28 != '\0') && (bVar4 = false, *pcStack_28 != ']')) {
            bVar4 = *pcStack_28 != '\n';
          }
          if (!bVar4) break;
          pcStack_28 = pcStack_28 + 1;
        }
        if (*pcStack_28 == ']') {
          start._4_4_ = ini_section_add(ini_00,pcVar3,(int)pcStack_28 - (int)pcVar3);
          pcStack_28 = pcStack_28 + 1;
        }
      }
      else {
        while( true ) {
          bVar4 = false;
          if ((*pcStack_28 != '\0') && (bVar4 = false, *pcStack_28 != '=')) {
            bVar4 = *pcStack_28 != '\n';
          }
          if (!bVar4) break;
          pcStack_28 = pcStack_28 + 1;
        }
        if (*pcStack_28 == '=') {
          iVar1 = (int)pcStack_28;
          do {
            pcStack_28 = pcStack_28 + 1;
            value = pcStack_28;
            bVar4 = false;
            if ((*pcStack_28 != '\0') && (bVar4 = false, *pcStack_28 < '!')) {
              bVar4 = *pcStack_28 != '\n';
            }
          } while (bVar4);
          while( true ) {
            bVar4 = false;
            if (*pcStack_28 != '\0') {
              bVar4 = *pcStack_28 != '\n';
            }
            pcVar2 = pcStack_28;
            if (!bVar4) break;
            pcStack_28 = pcStack_28 + 1;
          }
          do {
            pcStack_28 = pcVar2;
            pcVar2 = pcStack_28 + -1;
          } while (pcStack_28[-1] < '!');
          ini_property_add(ini_00,start._4_4_,pcVar3,iVar1 - (int)pcVar3,value,
                           (int)pcStack_28 - (int)value);
        }
      }
    }
  }
  return ini_00;
}

Assistant:

ini_t* ini_load( char const* data, void* memctx )
    {
    ini_t* ini;
    char const* ptr;
    int s;
    char const* start;
    char const* start2;
    int l;

    ini = ini_create( memctx );

    ptr = data;
    if( ptr )
        {
        s = 0;
        while( *ptr )
            {
            /* trim leading whitespace */
            while( *ptr && *ptr <=' ' )
                ++ptr;
            
            /* done? */
            if( !*ptr ) break;

            /* comment */
            else if( *ptr == ';' )
                {
                while( *ptr && *ptr !='\n' )
                    ++ptr;
                }
            /* section */
            else if( *ptr == '[' )
                {
                ++ptr;
                start = ptr;
                while( *ptr && *ptr !=']' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == ']' )
                    {
                    s = ini_section_add( ini, start, (int)( ptr - start) );
                    ++ptr;
                    }
                }
            /* property */
            else
                {
                start = ptr;
                while( *ptr && *ptr !='=' && *ptr != '\n' )
                    ++ptr;

                if( *ptr == '=' )
                    {
                    l = (int)( ptr - start);
                    ++ptr;
                    while( *ptr && *ptr <= ' ' && *ptr != '\n' ) 
                        ptr++;
                    start2 = ptr;
                    while( *ptr && *ptr != '\n' )
                        ++ptr;
                    while( *(--ptr) <= ' ' ) 
                        (void)ptr;
                    ptr++;
                    ini_property_add( ini, s, start, l, start2, (int)( ptr - start2) );
                    }
                }
            }
        }   

    return ini;
    }